

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object___lookupGetter__
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int setter)

{
  int *piVar1;
  JSValue *pJVar2;
  JSValue *pJVar3;
  JSAtom prop;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  JSValue JVar8;
  JSValueUnion local_80;
  JSPropertyDescriptor desc;
  
  JVar8 = JS_ToObject(ctx,this_val);
  uVar7 = 6;
  if (((int)JVar8.tag == 6) || (prop = JS_ValueToAtom(ctx,*argv), prop == 0)) {
    prop = 0;
  }
  else {
    iVar4 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)JVar8.u.ptr,prop);
    if (-1 < iVar4) {
      while( true ) {
        if (iVar4 != 0) {
          if (((byte)desc.flags & 0x10) == 0) {
            uVar7 = 3;
            uVar5 = 0;
            uVar6 = 0;
          }
          else {
            pJVar2 = &desc.getter;
            pJVar3 = &desc.getter;
            if (setter != 0) {
              pJVar2 = &desc.setter;
              pJVar3 = &desc.setter;
            }
            piVar1 = (int *)(pJVar2->u).ptr;
            uVar7 = pJVar3->tag;
            if (0xfffffff4 < (uint)uVar7) {
              *piVar1 = *piVar1 + 1;
            }
            uVar6 = (ulong)piVar1 & 0xffffffff00000000;
            uVar5 = (ulong)piVar1 & 0xffffffff;
          }
          js_free_desc(ctx,&desc);
          goto LAB_0010e9f0;
        }
        JVar8 = JS_GetPrototypeFree(ctx,JVar8);
        if ((int)JVar8.tag == 2) break;
        if ((int)JVar8.tag == 6) {
          uVar7 = JVar8.tag & 0xffffffff;
          goto LAB_0010e9ed;
        }
        iVar4 = ctx->interrupt_counter;
        ctx->interrupt_counter = iVar4 + -1;
        if (((iVar4 < 2) && (iVar4 = __js_poll_interrupts(ctx), iVar4 != 0)) ||
           (iVar4 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)JVar8.u.ptr,prop), iVar4 < 0))
        goto LAB_0010e9ed;
      }
      uVar7 = 3;
    }
  }
LAB_0010e9ed:
  uVar5 = 0;
  uVar6 = 0;
LAB_0010e9f0:
  local_80 = JVar8.u;
  JS_FreeAtom(ctx,prop);
  if ((0xfffffff4 < (uint)JVar8.tag) &&
     (iVar4 = *local_80.ptr, *(int *)local_80.ptr = iVar4 + -1, iVar4 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar8);
  }
  JVar8.tag = uVar7;
  JVar8.u.ptr = (void *)(uVar6 | uVar5);
  return JVar8;
}

Assistant:

static JSValue js_object___lookupGetter__(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv, int setter)
{
    JSValue obj, res = JS_EXCEPTION;
    JSAtom prop = JS_ATOM_NULL;
    JSPropertyDescriptor desc;
    int has_prop;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;
    prop = JS_ValueToAtom(ctx, argv[0]);
    if (unlikely(prop == JS_ATOM_NULL))
        goto exception;

    for (;;) {
        has_prop = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), prop);
        if (has_prop < 0)
            goto exception;
        if (has_prop) {
            if (desc.flags & JS_PROP_GETSET)
                res = JS_DupValue(ctx, setter ? desc.setter : desc.getter);
            else
                res = JS_UNDEFINED;
            js_free_desc(ctx, &desc);
            break;
        }
        obj = JS_GetPrototypeFree(ctx, obj);
        if (JS_IsException(obj))
            goto exception;
        if (JS_IsNull(obj)) {
            res = JS_UNDEFINED;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }

exception:
    JS_FreeAtom(ctx, prop);
    JS_FreeValue(ctx, obj);
    return res;
}